

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockPluginTest.cpp
# Opt level: O0

void __thiscall
TEST_MockPlugin_shouldNotFailAgainWhenTestAlreadyFailed_Test::testBody
          (TEST_MockPlugin_shouldNotFailAgainWhenTestAlreadyFailed_Test *this)

{
  SimpleString local_60 [2];
  undefined1 local_40 [8];
  TestTestingFixture fixture;
  TEST_MockPlugin_shouldNotFailAgainWhenTestAlreadyFailed_Test *this_local;
  
  fixture.result_ = (TestResult *)this;
  TestTestingFixture::TestTestingFixture((TestTestingFixture *)local_40);
  TestTestingFixture::installPlugin
            ((TestTestingFixture *)local_40,
             &(this->super_TEST_GROUP_CppUTestGroupMockPlugin).plugin.super_TestPlugin);
  TestTestingFixture::setTestFunction((TestTestingFixture *)local_40,failTwiceFunction_);
  TestTestingFixture::runAllTests((TestTestingFixture *)local_40);
  SimpleString::SimpleString(local_60,"1 failures, 1 tests, 1 ran, 2 checks,");
  TestTestingFixture::assertPrintContains((TestTestingFixture *)local_40,local_60);
  SimpleString::~SimpleString(local_60);
  TestTestingFixture::~TestTestingFixture((TestTestingFixture *)local_40);
  return;
}

Assistant:

TEST(MockPlugin, shouldNotFailAgainWhenTestAlreadyFailed)
{
    TestTestingFixture fixture;
    fixture.installPlugin(&plugin);
    fixture.setTestFunction(failTwiceFunction_);
    fixture.runAllTests();
    fixture.assertPrintContains("1 failures, 1 tests, 1 ran, 2 checks,");
}